

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<QAccessible::ActivationObserver_*>::remove
          (QList<QAccessible::ActivationObserver_*> *this,char *__filename)

{
  QList<QAccessible::ActivationObserver_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  ActivationObserver **in_stack_00000018;
  QPodArrayOps<QAccessible::ActivationObserver_*> *in_stack_00000020;
  QArrayDataPointer<QAccessible::ActivationObserver_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QAccessible::ActivationObserver_*>::detach(&this->d,in_stack_ffffffffffffffd8)
    ;
    QArrayDataPointer<QAccessible::ActivationObserver_*>::operator->(&this->d);
    QArrayDataPointer<QAccessible::ActivationObserver_*>::operator->(&this->d);
    QArrayDataPointer<QAccessible::ActivationObserver_*>::begin
              ((QArrayDataPointer<QAccessible::ActivationObserver_*> *)0x963729);
    QtPrivate::QPodArrayOps<QAccessible::ActivationObserver_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}